

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  TPZGeoEl *sideorient_00;
  TPZGeoNode *this_00;
  long *plVar3;
  TPZConnect *this_01;
  uint *puVar4;
  pair<int,_long> *this_02;
  long in_RSI;
  long *in_RDI;
  int ish;
  int nvec_shape;
  TPZShapeData *shapedata;
  int i_2;
  int i_1;
  int i;
  TPZGeoEl *gel;
  TPZManVector<int,_3> sideorient;
  TPZShapeData *in_stack_000000e8;
  TPZVec<int> *in_stack_000000f0;
  TPZVec<int> *in_stack_000000f8;
  TPZManVector<int,_7> orders;
  TPZManVector<long,_3> ids;
  undefined8 in_stack_fffffffffffffe78;
  TPZShapeData *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar5;
  int *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  int64_t in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  TPZManVector<std::pair<int,_long>,_20> *in_stack_fffffffffffffef0;
  TPZFMatrix<double> *in_stack_fffffffffffffef8;
  int local_100;
  int local_fc;
  long local_f8;
  int local_ec;
  int iVar6;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar7;
  TPZVec<long> *in_stack_ffffffffffffff30;
  TPZVec<int> local_88 [2];
  TPZVec<long> local_48;
  long local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_3>::TPZManVector
            ((TPZManVector<long,_3> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (int64_t)in_stack_fffffffffffffe98);
  TPZManVector<int,_7>::TPZManVector
            ((TPZManVector<int,_7> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,
             (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  uVar7 = 0;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,
             (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  sideorient_00 =
       TPZCompEl::Reference
                 ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  for (iVar6 = 0; iVar6 < 3; iVar6 = iVar6 + 1) {
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                in_stack_fffffffffffffe8c);
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](&local_48,(long)iVar6);
    *plVar3 = (long)iVar2;
  }
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar2);
    bVar1 = TPZConnect::Order(this_01);
    in_stack_fffffffffffffea4 = (uint)bVar1;
    puVar4 = (uint *)TPZVec<int>::operator[](local_88,(long)iVar2);
    *puVar4 = in_stack_fffffffffffffea4;
  }
  for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
    in_stack_fffffffffffffea0 =
         SideOrient((TPZCompElHDiv<pzshape::TPZShapeTriang> *)in_stack_fffffffffffffe80,
                    (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    in_stack_fffffffffffffe98 =
         TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff30,(long)local_ec);
    *in_stack_fffffffffffffe98 = in_stack_fffffffffffffea0;
  }
  local_f8 = local_10;
  local_fc = 0;
  iVar5 = (int)in_RDI[0x1a];
  if (iVar5 == 0) {
    TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
              ((TPZVec<long> *)orders.super_TPZVec<int>._vptr_TPZVec,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8);
    in_stack_fffffffffffffe90 =
         TPZShapeHDiv<pzshape::TPZShapeTriang>::NShapeF(in_stack_fffffffffffffe80);
    local_fc = in_stack_fffffffffffffe90;
  }
  else if (iVar5 == 1) {
    TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Initialize
              (in_stack_ffffffffffffff30,(TPZVec<int> *)CONCAT44(uVar7,in_stack_ffffffffffffff28),
               (TPZVec<int> *)sideorient_00,(TPZShapeData *)CONCAT44(iVar6,iVar2));
    local_fc = (**(code **)(*in_RDI + 600))();
  }
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffef8,(int64_t)in_stack_fffffffffffffef0,(int64_t)in_RDI);
  TPZManVector<std::pair<int,_long>,_20>::Resize(in_stack_fffffffffffffef0,(int64_t)in_RDI);
  for (local_100 = 0; local_100 < local_fc; local_100 = local_100 + 1) {
    in_stack_fffffffffffffe80 =
         (TPZShapeData *)
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)
                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    (int64_t)in_stack_fffffffffffffe98,CONCAT44(iVar5,in_stack_fffffffffffffe90));
    *(double *)in_stack_fffffffffffffe80 = 1.0;
    std::pair<int,_long>::pair<int_&,_int_&,_true>
              ((pair<int,_long> *)&stack0xfffffffffffffef0,&local_100,&local_100);
    this_02 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_100);
    std::pair<int,_long>::operator=(this_02,(type)&stack0xfffffffffffffef0);
  }
  *(undefined4 *)(local_10 + 8) = 3;
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffffe80);
  TPZManVector<int,_7>::~TPZManVector((TPZManVector<int,_7> *)in_stack_fffffffffffffe80);
  TPZManVector<long,_3>::~TPZManVector((TPZManVector<long,_3> *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}